

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O0

MatrixXd * lf::io::anon_unknown_1::AuxNodesQuad(MatrixXd *__return_storage_ptr__,uchar order)

{
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *b;
  RowXpr local_230;
  Scalar local_1f8;
  ConstantReturnType local_1f0;
  double local_1d8;
  double local_1d0;
  RandomAccessLinSpacedReturnType local_1c8;
  KroneckerProduct<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_190;
  non_const_type local_138;
  RowXpr local_130;
  double local_e8;
  double local_e0;
  RandomAccessLinSpacedReturnType local_d8;
  ConstTransposeReturnType local_a0;
  Replicate<Eigen::Transpose<const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,__1>
  local_68;
  RefElType local_1d;
  uint local_1c [2];
  undefined1 local_12;
  byte local_11;
  MatrixXd *pMStack_10;
  uchar order_local;
  MatrixXd *result;
  
  local_12 = 0;
  local_1c[1] = 2;
  local_11 = order;
  pMStack_10 = __return_storage_ptr__;
  local_1d = (RefElType)lf::base::RefEl::kQuad();
  local_1c[0] = NumAuxNodes((RefEl)local_1d,local_11);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)(local_1c + 1),local_1c);
  local_e0 = 1.0 / (double)local_11;
  local_e8 = ((double)local_11 - 1.0) / (double)local_11;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::LinSpaced
            (&local_d8,(ulong)(uint)local_11 - 1,&local_e0,&local_e8);
  Eigen::
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::transpose(&local_a0,
              (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_d8);
  Eigen::
  DenseBase<Eigen::Transpose<const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
  ::replicate(&local_68,
              (DenseBase<Eigen::Transpose<const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
               *)&local_a0,1,(ulong)local_11 - 1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_130,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,0);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_130,
             (DenseBase<Eigen::Replicate<Eigen::Transpose<const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,__1>_>
              *)&local_68);
  local_1d0 = 1.0 / (double)local_11;
  local_1d8 = ((double)local_11 - 1.0) / (double)local_11;
  b = (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
       *)&local_1d8;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::LinSpaced
            (&local_1c8,(ulong)(uint)local_11 - 1,&local_1d0,(Scalar *)b);
  local_1f8 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Constant
            (&local_1f0,(ulong)local_11 - 1,&local_1f8);
  Eigen::
  kroneckerProduct<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&local_190,(Eigen *)&local_1c8,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_1f0,b);
  local_138 = (non_const_type)
              Eigen::
              DenseBase<Eigen::ReturnByValue<Eigen::KroneckerProduct<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>
              ::transpose((DenseBase<Eigen::ReturnByValue<Eigen::KroneckerProduct<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                           *)&local_190);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_230,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,1);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_230,
             (DenseBase<Eigen::Transpose<Eigen::ReturnByValue<Eigen::KroneckerProduct<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
              *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd AuxNodesQuad(unsigned char order) {
  Eigen::MatrixXd result(2, NumAuxNodes(base::RefEl::kQuad(), order));
  result.row(0) =
      Eigen::VectorXd::LinSpaced(order - 1, 1. / order, (order - 1.) / order)
          .transpose()
          .replicate(1, order - 1);
  result.row(1) =
      Eigen::kroneckerProduct(Eigen::VectorXd::LinSpaced(order - 1, 1. / order,
                                                         (order - 1.) / order),
                              Eigen::VectorXd::Constant(order - 1, 1.))
          .transpose();
  return result;
}